

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O2

void __thiscall kj::TestCase35::run(TestCase35 *this)

{
  TupleElement<1U,_kj::StringPtr> *pTVar1;
  TupleElement<2U,_kj::StringPtr> *b;
  TupleElement<3U,_kj::StringPtr> *b_00;
  TupleElement<4U,_kj::String> *b_01;
  TupleElement<1U,_kj::Bar> TVar2;
  size_t params_2;
  size_t params_2_00;
  bool bVar3;
  Tuple<StringPtr,_StringPtr,_StringPtr,_StringPtr,_String> *params_1;
  undefined7 uVar5;
  char *pcVar4;
  String *params_1_00;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_const_char_(&)[4],_kj::String> *params_1_01;
  char *in_R8;
  Bar *ptrCopy;
  Foo *ptrCopy_1;
  uint local_204;
  Array<char> local_200;
  Bar local_1e8;
  Foo local_1e4;
  Tuple<String,_StringPtr> t5;
  Tuple<Foo,_Bar,_Baz,_Qux,_Quux> t2;
  Own<kj::Foo> local_1a0;
  Tuple<StringPtr,_StringPtr,_StringPtr,_StringPtr,_String> t6;
  Own<kj::Qux> local_138;
  char *local_128;
  size_t sStack_120;
  Disposer *local_118;
  Tuple<Foo,_Bar> t;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::StringPtr_&&,_kj::StringPtr_&&,_const_char_(&)[4],_kj::_::Tuple<const_char_*,_kj::String>_>
  local_108;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_const_char_(&)[4],_kj::String> local_c0;
  Tuple<Own<Foo>,_Own<Bar>,_Own<Baz>,_Own<Qux>,_Own<Quux>_> t4;
  Tuple<Own<Foo>,_Own<Bar>_> t3;
  
  t.impl.super_TupleElement<0U,_kj::Foo>.value.foo = (Foo)0x7b;
  t.impl.super_TupleElement<1U,_kj::Bar>.value.bar = (Bar)0x1c8;
  t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.disposer =
       (Disposer *)
       CONCAT44(t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.disposer._4_4_,0x315);
  params_1 = &t6;
  t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr = (char *)0x28e00000141;
  tuple<kj::_::Tuple<kj::Foo,kj::Bar>&,kj::Baz,kj::_::Tuple<kj::Qux,kj::Quux>>
            (&t2,(kj *)&t,(Tuple<kj::Foo,_kj::Bar> *)&t4,(Baz *)params_1,
             (Tuple<kj::Qux,_kj::Quux> *)in_R8);
  uVar5 = (undefined7)((ulong)params_1 >> 8);
  if (_::Debug::minSeverity < 3 && t2.impl.super_TupleElement<0U,_kj::Foo>.value.foo != 0x7b) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,0x7b
                         );
    uVar5 = 0x33bd;
    in_R8 = "failed: expected (123u) == (get<0>(t2).foo)";
    _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x29,ERROR,
               "\"failed: expected \" \"(123u) == (get<0>(t2).foo)\", 123u, get<0>(t2).foo",
               (char (*) [44])"failed: expected (123u) == (get<0>(t2).foo)",(uint *)&t6,(uint *)&t2)
    ;
  }
  if (_::Debug::minSeverity < 3 && t2.impl.super_TupleElement<1U,_kj::Bar>.value.bar != 0x1c8) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x1c8);
    uVar5 = 0x33be;
    in_R8 = "failed: expected (456u) == (get<1>(t2).bar)";
    _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x2a,ERROR,
               "\"failed: expected \" \"(456u) == (get<1>(t2).bar)\", 456u, get<1>(t2).bar",
               (char (*) [44])"failed: expected (456u) == (get<1>(t2).bar)",(uint *)&t6,
               (uint *)&t2.impl.super_TupleElement<1U,_kj::Bar>);
  }
  pcVar4 = (char *)CONCAT71(uVar5,t2.impl.super_TupleElement<2U,_kj::Baz>.value.baz != 0x315);
  if (_::Debug::minSeverity < 3 && t2.impl.super_TupleElement<2U,_kj::Baz>.value.baz != 0x315) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x315);
    pcVar4 = "\"failed: expected \" \"(789u) == (get<2>(t2).baz)\", 789u, get<2>(t2).baz";
    in_R8 = "failed: expected (789u) == (get<2>(t2).baz)";
    _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x2b,ERROR,
               "\"failed: expected \" \"(789u) == (get<2>(t2).baz)\", 789u, get<2>(t2).baz",
               (char (*) [44])"failed: expected (789u) == (get<2>(t2).baz)",(uint *)&t6,
               (uint *)&t2.impl.super_TupleElement<2U,_kj::Baz>);
  }
  if ((t2.impl.super_TupleElement<3U,_kj::Qux>.value.qux != 0x141) && (_::Debug::minSeverity < 3)) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x141);
    pcVar4 = "\"failed: expected \" \"(321u) == (get<3>(t2).qux)\", 321u, get<3>(t2).qux";
    in_R8 = "failed: expected (321u) == (get<3>(t2).qux)";
    _::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(321u) == (get<3>(t2).qux)\", 321u, get<3>(t2).qux",
               (char (*) [44])"failed: expected (321u) == (get<3>(t2).qux)",(uint *)&t6,
               (uint *)&t2.impl.super_TupleElement<3U,_kj::Qux>);
  }
  if ((t2.impl.super_TupleElement<4U,_kj::Quux>.value.quux != 0x28e) && (_::Debug::minSeverity < 3))
  {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x28e);
    pcVar4 = "\"failed: expected \" \"(654u) == (get<4>(t2).quux)\", 654u, get<4>(t2).quux";
    in_R8 = "failed: expected (654u) == (get<4>(t2).quux)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x2d,ERROR,
               "\"failed: expected \" \"(654u) == (get<4>(t2).quux)\", 654u, get<4>(t2).quux",
               (char (*) [45])"failed: expected (654u) == (get<4>(t2).quux)",(uint *)&t6,
               (uint *)&t2.impl.super_TupleElement<4U,_kj::Quux>);
  }
  t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = (size_t)operator_new(4);
  *(undefined4 *)t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = 0x7b;
  t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr = "H\x14B";
  t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr = (Foo *)operator_new(4);
  (t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr)->foo = 0x1c8;
  t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.disposer =
       (Disposer *)&_::HeapDisposer<kj::Bar>::instance;
  tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>(&t3,(kj *)&t6,(Own<kj::Foo> *)&t4,(Own<kj::Bar> *)pcVar4)
  ;
  if (t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr != (Foo *)0x0) {
    t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr = (Foo *)0x0;
    (**(t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.disposer)->_vptr_Disposer)();
  }
  if (t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ != 0) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = 0;
    (*(code *)**(undefined8 **)t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr)();
  }
  if ((t3.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr)->foo != 0x7b &&
      _::Debug::minSeverity < 3) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,0x7b
                         );
    in_R8 = "failed: expected (123u) == (get<0>(t3)->foo)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"(123u) == (get<0>(t3)->foo)\", 123u, get<0>(t3)->foo",
               (char (*) [45])"failed: expected (123u) == (get<0>(t3)->foo)",(uint *)&t6,
               &(t3.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr)->foo);
  }
  if (((t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar != 0x1c8) &&
     (_::Debug::minSeverity < 3)) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x1c8);
    in_R8 = "failed: expected (456u) == (get<1>(t3)->bar)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"(456u) == (get<1>(t3)->bar)\", 456u, get<1>(t3)->bar",
               (char (*) [45])"failed: expected (456u) == (get<1>(t3)->bar)",(uint *)&t6,
               &(t3.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar);
  }
  local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = (size_t)operator_new(4)
  ;
  ((Foo *)local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_)->foo = 0x315;
  local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
       (char *)&_::HeapDisposer<kj::Baz>::instance;
  t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = (size_t)operator_new(4);
  *(undefined4 *)t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0x141;
  t5.impl.super_TupleElement<0U,_kj::String>.value.content.ptr =
       (char *)&_::HeapDisposer<kj::Qux>::instance;
  local_138.ptr = (Qux *)operator_new(4);
  (local_138.ptr)->qux = 0x28e;
  local_138.disposer = (Disposer *)&_::HeapDisposer<kj::Quux>::instance;
  tuple<kj::Own<kj::Qux>,kj::Own<kj::Quux>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_> *)&t6
             ,(kj *)&t5,&local_138,(Own<kj::Quux> *)&_::HeapDisposer<kj::Quux>::instance);
  tuple<kj::_::Tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>,kj::Own<kj::Baz>,kj::_::Tuple<kj::Own<kj::Qux>,kj::Own<kj::Quux>>>
            (&t4,(kj *)&t3,(Tuple<kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)&local_108,
             (Own<kj::Baz> *)&t6,(Tuple<kj::Own<kj::Qux>,_kj::Own<kj::Quux>_> *)in_R8);
  _::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>::~TupleImpl
            ((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_> *)&t6);
  if (local_138.ptr != (Qux *)0x0) {
    local_138.ptr = (Qux *)0x0;
    (**(local_138.disposer)->_vptr_Disposer)();
  }
  if (t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ != 0) {
    t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
    (*(code *)**(undefined8 **)t5.impl.super_TupleElement<0U,_kj::String>.value.content.ptr)();
  }
  if ((Foo *)local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ != (Foo *)0x0)
  {
    local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = 0;
    (***(_func_int ***)local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr)();
  }
  if ((t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr)->foo != 0x7b &&
      _::Debug::minSeverity < 3) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,0x7b
                         );
    in_R8 = "failed: expected (123u) == (get<0>(t4)->foo)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"(123u) == (get<0>(t4)->foo)\", 123u, get<0>(t4)->foo",
               (char (*) [45])"failed: expected (123u) == (get<0>(t4)->foo)",(uint *)&t6,
               &(t4.impl.super_TupleElement<0U,_kj::Own<kj::Foo>_>.value.ptr)->foo);
  }
  if (_::Debug::minSeverity < 3 &&
      (t4.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar != 0x1c8) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x1c8);
    in_R8 = "failed: expected (456u) == (get<1>(t4)->bar)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"(456u) == (get<1>(t4)->bar)\", 456u, get<1>(t4)->bar",
               (char (*) [45])"failed: expected (456u) == (get<1>(t4)->bar)",(uint *)&t6,
               &(t4.impl.super_TupleElement<1U,_kj::Own<kj::Bar>_>.value.ptr)->bar);
  }
  if (_::Debug::minSeverity < 3 &&
      (t4.impl.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.ptr)->baz != 0x315) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x315);
    in_R8 = "failed: expected (789u) == (get<2>(t4)->baz)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x37,ERROR,
               "\"failed: expected \" \"(789u) == (get<2>(t4)->baz)\", 789u, get<2>(t4)->baz",
               (char (*) [45])"failed: expected (789u) == (get<2>(t4)->baz)",(uint *)&t6,
               &(t4.impl.super_TupleElement<2U,_kj::Own<kj::Baz>_>.value.ptr)->baz);
  }
  if (((t4.impl.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.ptr)->qux != 0x141) &&
     (_::Debug::minSeverity < 3)) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x141);
    in_R8 = "failed: expected (321u) == (get<3>(t4)->qux)";
    _::Debug::log<char_const(&)[45],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x38,ERROR,
               "\"failed: expected \" \"(321u) == (get<3>(t4)->qux)\", 321u, get<3>(t4)->qux",
               (char (*) [45])"failed: expected (321u) == (get<3>(t4)->qux)",(uint *)&t6,
               &(t4.impl.super_TupleElement<3U,_kj::Own<kj::Qux>_>.value.ptr)->qux);
  }
  if (((t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr)->quux != 0x28e) &&
     (_::Debug::minSeverity < 3)) {
    t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr =
         (char *)CONCAT44(t6.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr._4_4_,
                          0x28e);
    pcVar4 = "\"failed: expected \" \"(654u) == (get<4>(t4)->quux)\", 654u, get<4>(t4)->quux";
    in_R8 = "failed: expected (654u) == (get<4>(t4)->quux)";
    _::Debug::log<char_const(&)[46],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"(654u) == (get<4>(t4)->quux)\", 654u, get<4>(t4)->quux",
               (char (*) [46])"failed: expected (654u) == (get<4>(t4)->quux)",(uint *)&t6,
               &(t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr)->quux);
    t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr = (Quux *)pcVar4;
  }
  heapString((String *)&local_108,"foo");
  tuple<kj::String,char_const(&)[4]>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::String,_const_char_(&)[4]> *)&t6,
             (kj *)&local_108,(String *)0x33b5a1,
             (char (*) [4])t4.impl.super_TupleElement<4U,_kj::Own<kj::Quux>_>.value.ptr);
  _::TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr>::TupleImpl<kj::String,char_const*>
            ((TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr> *)&t5,
             (Tuple<kj::String,_const_char_*> *)&t6);
  Array<char>::~Array((Array<char> *)&t6);
  Array<char>::~Array((Array<char> *)&local_108);
  bVar3 = operator==("foo",(String *)&t5);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    in_R8 = "failed: expected (\"foo\") == (get<0>(t5))";
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x3c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t5))\", \"foo\", get<0>(t5)",
               (char (*) [41])"failed: expected (\"foo\") == (get<0>(t5))",(char (*) [4])0x357ec7,
               (String *)&t5);
  }
  pTVar1 = &t5.impl.super_TupleElement<1U,_kj::StringPtr>;
  bVar3 = operator==("bar",&pTVar1->value);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    in_R8 = "failed: expected (\"bar\") == (get<1>(t5))";
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x3d,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t5))\", \"bar\", get<1>(t5)",
               (char (*) [41])"failed: expected (\"bar\") == (get<1>(t5))",(char (*) [4])0x33b5a1,
               &pTVar1->value);
  }
  params_1_00 = (String *)t5.impl.super_TupleElement<0U,_kj::String>.value.content.ptr;
  if (t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ == 0) {
    params_1_00 = (String *)0x33812f;
  }
  local_138.ptr =
       (Qux *)(t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ +
              (t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ == 0));
  local_128 = t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.ptr;
  sStack_120 = t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_;
  local_138.disposer = (Disposer *)params_1_00;
  heapString((String *)&local_200,"quux");
  tuple<char_const(&)[4],kj::String>(&local_c0,(kj *)0x33760d,(char (*) [4])&local_200,params_1_00);
  params_1_01 = &local_c0;
  tuple<kj::_::Tuple<kj::StringPtr,kj::StringPtr>,char_const(&)[4],kj::_::Tuple<char_const*,kj::String>>
            (&local_108,(kj *)&local_138,(Tuple<kj::StringPtr,_kj::StringPtr> *)0x3301d1,
             (char (*) [4])params_1_01,(Tuple<const_char_*,_kj::String> *)in_R8);
  _::
  TupleImpl<kj::_::Indexes<0ul,1ul,2ul,3ul,4ul>,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>
  ::TupleImpl<kj::StringPtr,kj::StringPtr,char_const*,char_const*,kj::String>
            ((TupleImpl<kj::_::Indexes<0ul,1ul,2ul,3ul,4ul>,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::StringPtr,kj::String>
              *)&t6,&local_108);
  Array<char>::~Array((Array<char> *)&local_108.impl.super_TupleElement<4U,_kj::String>);
  Array<char>::~Array((Array<char> *)&local_c0.impl.super_TupleElement<1U,_kj::String>);
  Array<char>::~Array(&local_200);
  bVar3 = operator==("foo",(StringPtr *)&t6);
  uVar5 = (undefined7)((ulong)params_1_01 >> 8);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    uVar5 = 0x33c4;
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x41,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<0>(t6))\", \"foo\", get<0>(t6)",
               (char (*) [41])"failed: expected (\"foo\") == (get<0>(t6))",(char (*) [4])0x357ec7,
               (StringPtr *)&t6);
  }
  pTVar1 = &t6.impl.super_TupleElement<1U,_kj::StringPtr>;
  bVar3 = operator==("bar",&pTVar1->value);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    uVar5 = 0x33c4;
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x42,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (get<1>(t6))\", \"bar\", get<1>(t6)",
               (char (*) [41])"failed: expected (\"bar\") == (get<1>(t6))",(char (*) [4])0x33b5a1,
               &pTVar1->value);
  }
  b = &t6.impl.super_TupleElement<2U,_kj::StringPtr>;
  bVar3 = operator==("baz",&b->value);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    uVar5 = 0x33c5;
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x43,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (get<2>(t6))\", \"baz\", get<2>(t6)",
               (char (*) [41])"failed: expected (\"baz\") == (get<2>(t6))",(char (*) [4])0x3301d1,
               &b->value);
  }
  b_00 = &t6.impl.super_TupleElement<3U,_kj::StringPtr>;
  bVar3 = operator==("qux",&b_00->value);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    uVar5 = 0x33c5;
    _::Debug::log<char_const(&)[41],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(\\\"qux\\\") == (get<3>(t6))\", \"qux\", get<3>(t6)",
               (char (*) [41])"failed: expected (\"qux\") == (get<3>(t6))",(char (*) [4])0x33760d,
               &b_00->value);
  }
  b_01 = &t6.impl.super_TupleElement<4U,_kj::String>;
  bVar3 = operator==("quux",&b_01->value);
  pcVar4 = (char *)CONCAT71(uVar5,2 < _::Debug::minSeverity);
  if (!bVar3 && 2 >= _::Debug::minSeverity) {
    pcVar4 = "\"failed: expected \" \"(\\\"quux\\\") == (get<4>(t6))\", \"quux\", get<4>(t6)";
    _::Debug::log<char_const(&)[42],char_const(&)[5],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x45,ERROR,
               "\"failed: expected \" \"(\\\"quux\\\") == (get<4>(t6))\", \"quux\", get<4>(t6)",
               (char (*) [42])"failed: expected (\"quux\") == (get<4>(t6))",(char (*) [5])0x33b5fb,
               &b_01->value);
  }
  local_200.size_ = (size_t)operator_new(4);
  *(undefined4 *)local_200.size_ = 0x7b;
  local_200.ptr = "H\x14B";
  local_1a0.ptr = (Foo *)operator_new(4);
  (local_1a0.ptr)->foo = 0x1c8;
  local_1a0.disposer = (Disposer *)&_::HeapDisposer<kj::Bar>::instance;
  tuple<kj::Own<kj::Foo>,kj::Own<kj::Bar>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)
             &local_108,(kj *)&local_200,&local_1a0,(Own<kj::Bar> *)pcVar4);
  params_2_00 = local_108.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_;
  params_2 = local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_;
  local_118 = (Disposer *)local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.ptr;
  local_108.impl.super_TupleElement<0U,_kj::StringPtr>.value.content.size_ = 0;
  local_108.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_ = 0;
  TVar2.value.bar = t.impl.super_TupleElement<1U,_kj::Bar>.value.bar;
  local_c0.impl.super_TupleElement<0U,_const_char_*>.value =
       t5.impl.super_TupleElement<0U,_kj::String>.value.content.ptr;
  if (t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ == 0) {
    local_c0.impl.super_TupleElement<0U,_const_char_*>.value = "";
  }
  local_c0.impl.super_TupleElement<1U,_kj::String>.value.content.ptr =
       (char *)(t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ +
               (t5.impl.super_TupleElement<0U,_kj::String>.value.content.size_ == 0));
  local_138.disposer = (Disposer *)t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.ptr;
  local_138.ptr = (Qux *)t5.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.size_;
  local_1e4 = t.impl.super_TupleElement<0U,_kj::Foo>.value.foo;
  local_1e8 = t.impl.super_TupleElement<1U,_kj::Bar>.value.bar;
  if (t.impl.super_TupleElement<0U,_kj::Foo>.value.foo != 0x7b) {
    if (2 < _::Debug::minSeverity) goto LAB_002408ce;
    local_204 = 0x7b;
    _::Debug::log<char_const(&)[35],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x48,ERROR,"\"failed: expected \" \"(123u) == (a.foo)\", 123u, a.foo",
               (char (*) [35])"failed: expected (123u) == (a.foo)",&local_204,&local_1e4.foo);
  }
  if (_::Debug::minSeverity < 3 && TVar2.value.bar != 0x1c8) {
    local_204 = 0x1c8;
    _::Debug::log<char_const(&)[35],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x49,ERROR,"\"failed: expected \" \"(456u) == (b.bar)\", 456u, b.bar",
               (char (*) [35])"failed: expected (456u) == (b.bar)",&local_204,&local_1e8.bar);
  }
LAB_002408ce:
  if (_::Debug::minSeverity < 3 && *(uint *)params_2 != 0x7b) {
    local_204 = 0x7b;
    _::Debug::log<char_const(&)[36],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4a,ERROR,"\"failed: expected \" \"(123u) == (c->foo)\", 123u, c->foo",
               (char (*) [36])"failed: expected (123u) == (c->foo)",&local_204,(uint *)params_2);
  }
  if ((*(uint *)params_2_00 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_204 = 0x1c8;
    _::Debug::log<char_const(&)[36],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4b,ERROR,"\"failed: expected \" \"(456u) == (d->bar)\", 456u, d->bar",
               (char (*) [36])"failed: expected (456u) == (d->bar)",&local_204,(uint *)params_2_00);
  }
  bVar3 = operator==("foo",(StringPtr *)&local_c0);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[32],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4d,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (f)\", \"foo\", f",
               (char (*) [32])"failed: expected (\"foo\") == (f)",(char (*) [4])0x357ec7,
               (StringPtr *)&local_c0);
  }
  bVar3 = operator==("bar",(StringPtr *)&local_138);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[32],char_const(&)[4],kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x4e,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (g)\", \"bar\", g",
               (char (*) [32])"failed: expected (\"bar\") == (g)",(char (*) [4])0x33b5a1,
               (StringPtr *)&local_138);
  }
  (***(_func_int ***)local_108.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.ptr)
            (local_108.impl.super_TupleElement<1U,_kj::StringPtr>.value.content.ptr,params_2_00);
  (**local_118->_vptr_Disposer)(local_118,params_2);
  _::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_>::~TupleImpl
            ((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_> *)&local_108)
  ;
  if (local_1a0.ptr != (Foo *)0x0) {
    local_1a0.ptr = (Foo *)0x0;
    (**(local_1a0.disposer)->_vptr_Disposer)();
  }
  if ((undefined4 *)local_200.size_ != (undefined4 *)0x0) {
    local_200.size_ = 0;
    (*(code *)**(undefined8 **)local_200.ptr)();
  }
  Array<char>::~Array((Array<char> *)&t6.impl.super_TupleElement<4U,_kj::String>);
  Array<char>::~Array((Array<char> *)&t5);
  _::
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>,_kj::Own<kj::Baz>,_kj::Own<kj::Qux>,_kj::Own<kj::Quux>_>
  ::~TupleImpl(&t4.impl);
  _::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::Foo>,_kj::Own<kj::Bar>_>::~TupleImpl(&t3.impl);
  return;
}

Assistant:

TEST(Tuple, Tuple) {
  Tuple<Foo, Bar> t = tuple(Foo(123), Bar(456));
  EXPECT_EQ(123u, get<0>(t).foo);
  EXPECT_EQ(456u, get<1>(t).bar);

  Tuple<Foo, Bar, Baz, Qux, Quux> t2 = tuple(t, Baz(789), tuple(Qux(321), Quux(654)));
  EXPECT_EQ(123u, get<0>(t2).foo);
  EXPECT_EQ(456u, get<1>(t2).bar);
  EXPECT_EQ(789u, get<2>(t2).baz);
  EXPECT_EQ(321u, get<3>(t2).qux);
  EXPECT_EQ(654u, get<4>(t2).quux);

  Tuple<Own<Foo>, Own<Bar>> t3 = tuple(heap<Foo>(123), heap<Bar>(456));
  EXPECT_EQ(123u, get<0>(t3)->foo);
  EXPECT_EQ(456u, get<1>(t3)->bar);

  Tuple<Own<Foo>, Own<Bar>, Own<Baz>, Own<Qux>, Own<Quux>> t4 =
      tuple(mv(t3), heap<Baz>(789), tuple(heap<Qux>(321), heap<Quux>(654)));
  EXPECT_EQ(123u, get<0>(t4)->foo);
  EXPECT_EQ(456u, get<1>(t4)->bar);
  EXPECT_EQ(789u, get<2>(t4)->baz);
  EXPECT_EQ(321u, get<3>(t4)->qux);
  EXPECT_EQ(654u, get<4>(t4)->quux);

  Tuple<String, StringPtr> t5 = tuple(heapString("foo"), "bar");
  EXPECT_EQ("foo", get<0>(t5));
  EXPECT_EQ("bar", get<1>(t5));

  Tuple<StringPtr, StringPtr, StringPtr, StringPtr, String> t6 =
      tuple(Tuple<StringPtr, StringPtr>(t5), "baz", tuple("qux", heapString("quux")));
  EXPECT_EQ("foo", get<0>(t6));
  EXPECT_EQ("bar", get<1>(t6));
  EXPECT_EQ("baz", get<2>(t6));
  EXPECT_EQ("qux", get<3>(t6));
  EXPECT_EQ("quux", get<4>(t6));

  kj::apply([](Foo a, Bar b, Own<Foo> c, Own<Bar> d, uint e, StringPtr f, StringPtr g) {
    EXPECT_EQ(123u, a.foo);
    EXPECT_EQ(456u, b.bar);
    EXPECT_EQ(123u, c->foo);
    EXPECT_EQ(456u, d->bar);
    EXPECT_EQ(789u, e);
    EXPECT_EQ("foo", f);
    EXPECT_EQ("bar", g);
  }, t, tuple(heap<Foo>(123), heap<Bar>(456)), 789, mv(t5));

  uint i = tuple(123);
  EXPECT_EQ(123u, i);

  i = tuple(tuple(), 456, tuple(tuple(), tuple()));
  EXPECT_EQ(456u, i);

  EXPECT_EQ(0, (indexOfType<int, Tuple<int, char, bool>>()));
  EXPECT_EQ(1, (indexOfType<char, Tuple<int, char, bool>>()));
  EXPECT_EQ(2, (indexOfType<bool, Tuple<int, char, bool>>()));
  EXPECT_EQ(0, (indexOfType<int, int>()));
}